

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O3

int If_Dec6PickBestMux(word t,word *Cofs)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  int Count;
  uint uVar6;
  int iVar7;
  int v_1;
  int v;
  ulong uVar8;
  long lVar9;
  word *pwVar10;
  ulong uVar11;
  int Count_1;
  uint uVar12;
  int local_3c;
  
  local_3c = -1;
  iVar7 = 1000;
  lVar3 = 0;
  do {
    uVar8 = ~Truth6[lVar3] & t;
    bVar1 = (byte)(1 << ((byte)lVar3 & 0x1f));
    uVar8 = uVar8 << (bVar1 & 0x3f) | uVar8;
    pwVar10 = Truth6;
    lVar9 = 0;
    uVar6 = 0;
    do {
      uVar11 = ~*pwVar10 & uVar8;
      bVar2 = (byte)(1 << ((byte)lVar9 & 0x1f));
      uVar4 = *pwVar10 & uVar8;
      uVar6 = uVar6 + ((uVar11 << (bVar2 & 0x3f) | uVar11) != (uVar4 >> (bVar2 & 0x3f) | uVar4));
      lVar9 = lVar9 + 1;
      pwVar10 = pwVar10 + 1;
    } while (lVar9 != 6);
    uVar4 = Truth6[lVar3] & t;
    uVar4 = uVar4 >> (bVar1 & 0x3f) | uVar4;
    lVar9 = 0;
    pwVar10 = Truth6;
    uVar12 = 0;
    do {
      uVar5 = ~*pwVar10 & uVar4;
      bVar1 = (byte)(1 << ((byte)lVar9 & 0x1f));
      uVar11 = *pwVar10 & uVar4;
      uVar12 = uVar12 + ((uVar5 << (bVar1 & 0x3f) | uVar5) != (uVar11 >> (bVar1 & 0x3f) | uVar11));
      lVar9 = lVar9 + 1;
      pwVar10 = pwVar10 + 1;
    } while (lVar9 != 6);
    if (((uVar6 < 5) && (uVar12 < 5)) && ((int)(uVar12 + uVar6) < iVar7)) {
      *Cofs = uVar8;
      Cofs[1] = uVar4;
      iVar7 = uVar12 + uVar6;
      local_3c = (int)lVar3;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 6);
  return local_3c;
}

Assistant:

int If_Dec6PickBestMux( word t, word Cofs[2] )
{
    int v, vBest = -1, Count0, Count1, CountBest = 1000;
    for ( v = 0; v < 6; v++ )
    {
        Count0 = If_Dec6SuppSize( If_Dec6Cofactor(t, v, 0) );
        Count1 = If_Dec6SuppSize( If_Dec6Cofactor(t, v, 1) );
        if ( Count0 < 5 && Count1 < 5 && CountBest > Count0 + Count1 )
        {
            CountBest = Count0 + Count1;
            vBest = v;
            Cofs[0] = If_Dec6Cofactor(t, v, 0);
            Cofs[1] = If_Dec6Cofactor(t, v, 1);
        }
    }
    return vBest;
}